

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

void * printable_vtable::clone_impl<large_printable>(void *value)

{
  large_printable *this;
  void *value_local;
  
  this = (large_printable *)operator_new(0x2018);
  large_printable::large_printable(this,(large_printable *)value);
  return this;
}

Assistant:

static void * clone_impl (void * value)
    { return new ValueType(*static_cast<ValueType*>(value)); }